

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.cpp
# Opt level: O2

void primaryexp(LexState *ls,expdesc *v)

{
  int iVar1;
  FuncState *fs;
  expdesc key;
  
  fs = ls->fs;
  iVar1 = (ls->t).token;
  if (iVar1 == 0x11d) {
    singlevar(ls,v);
  }
  else if (iVar1 == 0x28) {
    iVar1 = ls->linenumber;
    luaX_next(ls);
    expr(ls,v);
    check_match(ls,0x29,0x28,iVar1);
    luaK_dischargevars(ls->fs,v);
  }
  else {
    luaX_syntaxerror(ls,"unexpected symbol");
  }
  do {
    while ((iVar1 = (ls->t).token, iVar1 == 0x28 || (iVar1 == 0x11e))) {
LAB_0011094c:
      luaK_exp2nextreg(fs,v);
LAB_0011097a:
      funcargs(ls,v);
    }
    if (iVar1 == 0x3a) {
      luaX_next(ls);
      checkname(ls,&key);
      luaK_self(fs,v,&key);
      goto LAB_0011097a;
    }
    if (iVar1 == 0x5b) {
      luaK_exp2anyreg(fs,v);
      yindex(ls,&key);
      luaK_indexed(fs,v,&key);
    }
    else {
      if (iVar1 == 0x7b) goto LAB_0011094c;
      if (iVar1 != 0x2e) {
        return;
      }
      field(ls,v);
    }
  } while( true );
}

Assistant:

static void primaryexp (LexState *ls, expdesc *v) {
  /* primaryexp ->
        prefixexp { `.' NAME | `[' exp `]' | `:' NAME funcargs | funcargs } */
  FuncState *fs = ls->fs;
  prefixexp(ls, v);
  for (;;) {
    switch (ls->t.token) {
      case '.': {  /* field */
        field(ls, v);
        break;
      }
      case '[': {  /* `[' exp1 `]' */
        expdesc key;
        luaK_exp2anyreg(fs, v);
        yindex(ls, &key);
        luaK_indexed(fs, v, &key);
        break;
      }
      case ':': {  /* `:' NAME funcargs */
        expdesc key;
        luaX_next(ls);
        checkname(ls, &key);
        luaK_self(fs, v, &key);
        funcargs(ls, v);
        break;
      }
      case '(': case TK_STRING: case '{': {  /* funcargs */
        luaK_exp2nextreg(fs, v);
        funcargs(ls, v);
        break;
      }
      default: return;
    }
  }
}